

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_array(void)

{
  bool v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  basic_variable<std::allocator<char>_> *local_230;
  iterator local_218;
  iterator local_200;
  iterator local_1e8;
  iterator local_1d0;
  nullable local_1b4;
  basic_variable<std::allocator<char>_> *local_1b0;
  basic_variable<std::allocator<char>_> local_1a8;
  basic_variable<std::allocator<char>_> local_178;
  basic_variable<std::allocator<char>_> local_148;
  basic_variable<std::allocator<char>_> local_118;
  basic_variable<std::allocator<char>_> local_e8;
  undefined1 local_b8 [24];
  variable expect;
  basic_variable<std::allocator<char>_> result;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"[null,true,2,3.0,\"alpha\"]",&local_29);
  std::allocator<char>::~allocator(&local_29);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,(json *)local_28,
             input_00);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)&expect.storage.field_0x28);
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x120,"void parser_suite::parse_array()",v);
  local_1b0 = &local_1a8;
  local_1b4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1b0,&local_1b4);
  local_1b0 = &local_178;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1b0,true);
  local_1b0 = &local_148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1b0,2);
  local_1b0 = &local_118;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1b0,3.0);
  local_1b0 = &local_e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1b0,"alpha");
  local_b8._0_8_ = &local_1a8;
  local_b8._8_8_ = 5;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_b8);
  local_230 = (basic_variable<std::allocator<char>_> *)local_b8;
  do {
    local_230 = local_230 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_230);
  } while (local_230 != &local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d0,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_200,(basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x125,"void parser_suite::parse_array()",&local_1d0,&local_1e8,&local_200,&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void parse_array()
{
    std::string input = "[null,true,2,3.0,\"alpha\"]";
    auto result = json::parse(input);
    TRIAL_PROTOCOL_TEST(result.is<array>());

    variable expect = { null, true, 2, 3.0, "alpha" };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}